

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmStateSnapshot *this_00;
  cmListFileBacktrace *value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmake *pcVar2;
  element_type *peVar3;
  cmDebuggerAdapter *pcVar4;
  element_type *peVar5;
  cmListFileFunction *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pcVar9;
  bool bVar10;
  int iVar11;
  pointer __p;
  string *psVar12;
  pointer pcVar13;
  const_iterator cVar14;
  pointer __p_00;
  cmListFileFunction *pcVar15;
  long lVar16;
  element_type *peVar17;
  long *plVar18;
  bool bVar19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<cmListFileArgument> __l;
  string_view value_00;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  cmListFile listFile;
  string currentStart;
  cmListFileFunction project;
  string filesDir;
  BuildsystemFileScope scope;
  undefined1 local_268 [16];
  undefined1 local_258 [31];
  undefined1 local_239;
  undefined1 local_238 [20];
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  _Base_ptr local_218;
  size_t local_210;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  cmListFile local_1d8;
  long *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  element_type *local_1a0;
  element_type *local_198;
  undefined1 local_190 [72];
  undefined1 auStack_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_100;
  long local_e8 [2];
  BuildsystemFileScope local_d8;
  cmListFileContext local_a0;
  
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_d8,this_00);
  psVar12 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_d8);
  local_238._8_8_ = (psVar12->_M_dataplus)._M_p;
  local_238._0_8_ = psVar12->_M_string_length;
  stack0xfffffffffffffdd8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  _uStack_220 = 0xf;
  local_218 = (_Base_ptr)0x89e5f5;
  local_210 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_238;
  cmCatViews((string *)(local_190 + 0x10),views);
  cmListFileContext::FromListFilePath(&local_a0,(string *)(local_190 + 0x10));
  value = &this->Backtrace;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238,
             (cmListFileContext *)value);
  uVar8 = local_238._8_8_;
  uVar7 = local_238._0_8_;
  local_238._0_8_ = (element_type *)0x0;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar7;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  if ((local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (local_a0.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     local_a0.DeferId.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     ((pointer)
     ((long)&local_a0.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     + 0x10U))._M_p)) {
    operator_delete((void *)local_a0.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    local_a0.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
    operator_delete(local_a0.FilePath._M_dataplus._M_p,
                    local_a0.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
    operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::BuildsystemFileScope(&local_d8,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_268,this_00);
  psVar12 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_268);
  local_238._8_8_ = (psVar12->_M_dataplus)._M_p;
  local_238._0_8_ = psVar12->_M_string_length;
  stack0xfffffffffffffdd8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  _uStack_220 = (char *)0xb;
  local_218 = (_Base_ptr)0x8ab77a;
  local_210 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_238;
  cmCatViews(&local_120,views_00);
  cmsys::SystemTools::MakeDirectory(&local_120,(mode_t *)0x0);
  bVar10 = cmsys::SystemTools::FileExists((string *)(local_190 + 0x10),true);
  if (!bVar10) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx"
                  ,0x6d6,"void cmMakefile::Configure()");
  }
  local_238._0_8_ = (element_type *)(local_238 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"CMAKE_PARENT_LIST_FILE","");
  value_00._M_str = (char *)local_190._16_8_;
  value_00._M_len = local_190._24_8_;
  AddDefinition(this,(string *)local_238,value_00);
  if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,(ulong)(stack0xfffffffffffffdd8 + 1));
  }
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  peVar3 = (pcVar2->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pcVar2->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (peVar3 != (element_type *)0x0) {
    pcVar2 = this->GlobalGenerator->CMakeInstance;
    pcVar4 = (pcVar2->DebugAdapter).
             super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (pcVar2->DebugAdapter).
             super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    cmDebugger::cmDebuggerAdapter::OnBeginFileParse(pcVar4,this,(string *)(local_190 + 0x10));
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  local_1d8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (cmListFileFunction *)0x0;
  local_1d8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (cmListFileFunction *)0x0;
  local_1d8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar10 = cmListFile::ParseFile
                     (&local_1d8,(char *)local_190._16_8_,
                      (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                      super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                      super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                      super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,value);
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  peVar3 = (pcVar2->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pcVar2->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (!bVar10) {
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (peVar3 != (element_type *)0x0) {
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      pcVar4 = (pcVar2->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (pcVar2->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(pcVar4);
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    goto LAB_00305129;
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (peVar3 != (element_type *)0x0) {
    pcVar2 = this->GlobalGenerator->CMakeInstance;
    pcVar4 = (pcVar2->DebugAdapter).
             super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (pcVar2->DebugAdapter).
             super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    cmDebugger::cmDebuggerAdapter::OnEndFileParse(pcVar4);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    pcVar2 = this->GlobalGenerator->CMakeInstance;
    pcVar4 = (pcVar2->DebugAdapter).
             super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (pcVar2->DebugAdapter).
             super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
              (pcVar4,(string *)(local_190 + 0x10),&local_1d8.Functions);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_238,this_00);
  bVar10 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_238);
  pcVar9 = local_1d8.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_190._56_8_ = value;
  if (!bVar10) {
    pcVar13 = local_1d8.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00304991:
      if ((ulong)((long)pcVar9 - (long)pcVar13) < 0x1e0) {
        _uStack_220 = local_238 + 8;
        local_238._8_8_ = local_238._8_8_ & 0xffffffff00000000;
        stack0xfffffffffffffdd8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_210 = 0;
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        local_218 = (_Base_ptr)_uStack_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"project","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"set","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"if","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"endif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"else","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"elseif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"add_executable","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"add_library","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_268,"target_link_libraries","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"option","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"message","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
          operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
        }
        pcVar9 = local_1d8.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (local_1d8.Functions.
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1d8.Functions.
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238);
        }
        else {
          bVar10 = false;
          pcVar6 = local_1d8.Functions.
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar15 = pcVar6 + 1;
            cVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_238,
                            &((pcVar6->Impl).
                              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->LowerCaseName);
            if (cVar14._M_node == (_Base_ptr)(local_238 + 8)) {
              bVar10 = true;
              break;
            }
            pcVar6 = pcVar15;
          } while (pcVar15 != pcVar9);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238);
          if (bVar10) goto LAB_00304cf3;
        }
      }
      else {
LAB_00304cf3:
        this->CheckCMP0000 = true;
        cmPolicies::ApplyPolicyVersion(this,2,4,0,Off);
      }
    }
    else {
      local_190._48_8_ =
           local_1d8.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
      pcVar6 = local_1d8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pcVar15 = pcVar6 + 1;
        peVar5 = (pcVar6->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if ((peVar5->LowerCaseName)._M_string_length == 0x16) {
          iVar11 = bcmp((peVar5->LowerCaseName)._M_dataplus._M_p,"cmake_minimum_required",0x16);
          bVar10 = iVar11 == 0;
        }
        else {
          bVar10 = false;
        }
        bVar19 = false;
        if (bVar10) {
          bVar19 = true;
          break;
        }
        pcVar6 = pcVar15;
      } while (pcVar15 != pcVar9);
      pcVar13 = (pointer)local_190._48_8_;
      if (!bVar19) goto LAB_00304991;
    }
    pcVar9 = local_1d8.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar10 = false;
      pcVar6 = local_1d8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pcVar15 = pcVar6 + 1;
        peVar5 = (pcVar6->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if ((peVar5->LowerCaseName)._M_string_length == 7) {
          iVar11 = bcmp((peVar5->LowerCaseName)._M_dataplus._M_p,"project",7);
          bVar19 = iVar11 == 0;
        }
        else {
          bVar19 = false;
        }
        if (bVar19) {
          bVar10 = true;
          break;
        }
        pcVar6 = pcVar15;
      } while (pcVar15 != pcVar9);
      if (bVar10) goto LAB_00305048;
    }
    pcVar2 = this->GlobalGenerator->CMakeInstance;
    local_238._0_8_ = (element_type *)(local_238 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,
               "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
               ,"");
    cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_238,
                        (cmListFileBacktrace *)local_190._56_8_);
    if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(stack0xfffffffffffffdd8 + 1));
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_148 + 8),"project","");
    local_1a0 = (element_type *)local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Project","");
    local_238._0_8_ = local_238 + 0x10;
    if (local_1a0 == (element_type *)local_190) {
      uStack_21c = local_190._12_4_;
      uStack_220 = local_190._8_4_;
    }
    else {
      local_238._0_8_ = local_1a0;
    }
    uStack_224 = local_190._4_4_;
    local_238._16_4_ = local_190._0_4_;
    local_238._8_8_ = local_198;
    local_198 = (element_type *)0x0;
    local_190._0_4_ = local_190._0_4_ & 0xffffff00;
    local_218 = (_Base_ptr)((ulong)local_218 & 0xffffffff00000000);
    local_210 = 0;
    local_1c0 = (long *)&local_1b0;
    local_1a0 = (element_type *)local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,"__CMAKE_INJECTED_PROJECT_COMMAND__","");
    plVar18 = &local_1f8;
    if (local_1c0 == (long *)&local_1b0) {
      uStack_1f0 = uStack_1a8;
      local_208 = plVar18;
    }
    else {
      local_208 = local_1c0;
    }
    local_200 = local_1b8;
    local_1b8 = 0;
    local_1b0 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
    __l._M_len = 2;
    __l._M_array = (iterator)local_238;
    local_1c0 = (long *)&local_1b0;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
              (&local_100,__l,(allocator_type *)(local_258 + 0x1e));
    local_e8[1] = 0;
    local_e8[0] = 0;
    local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8),
               (Implementation **)local_268,
               (allocator<cmListFileFunction::Implementation> *)&local_239,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (auStack_148 + 8),local_e8 + 1,local_e8,&local_100);
    local_190._64_8_ = local_268._0_8_;
    auStack_148 = (undefined1  [8])local_268._8_8_;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_100);
    lVar16 = -0x60;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -6;
      lVar16 = lVar16 + 0x30;
    } while (lVar16 != 0);
    if (local_1c0 != (long *)&local_1b0) {
      operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
    }
    if (local_1a0 != (element_type *)local_190) {
      operator_delete(local_1a0,CONCAT44(local_190._4_4_,local_190._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              (&local_1d8.Functions,
               (const_iterator)
               local_1d8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start,(value_type *)(local_190 + 0x40));
    if (auStack_148 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_148);
    }
  }
LAB_00305048:
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._0_8_ = (element_type *)0x0;
  std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
         *)&this->Defer,__p_00);
  std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  ~unique_ptr((unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
               *)local_238);
  RunListFile(this,&local_1d8,(string *)(local_190 + 0x10),
              (this->Defer)._M_t.
              super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
              .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
         *)&this->Defer,(pointer)0x0);
  if ((cmSystemTools::s_FatalErrorOccurred != false) ||
     (bVar10 = cmSystemTools::GetInterruptFlag(), bVar10)) {
    local_d8.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_238,
             &this->UnConfiguredDirectories);
  peVar17 = (element_type *)local_238._0_8_;
  if (local_238._0_8_ != local_238._8_8_) {
    do {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand
                ((cmStateSnapshot *)((peVar17->Value).Name._M_dataplus._M_p + 0x2d0));
      ConfigureSubDirectory(this,(cmMakefile *)(peVar17->Value).Name._M_dataplus._M_p);
      peVar17 = (element_type *)&(peVar17->Value).Name._M_string_length;
    } while (peVar17 != (element_type *)local_238._8_8_);
  }
  AddCMakeDependFilesFromUser(this);
  if ((element_type *)local_238._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_238._0_8_,stack0xfffffffffffffdd8 - local_238._0_8_);
  }
LAB_00305129:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            (&local_1d8.Functions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::~BuildsystemFileScope(&local_d8);
  if ((undefined1 *)local_190._16_8_ != local_190 + 0x20) {
    operator_delete((void *)local_190._16_8_,(ulong)(local_190._32_8_ + 1));
  }
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentSource(), "/CMakeLists.txt");

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace =
    this->Backtrace.Push(cmListFileContext::FromListFilePath(currentStart));

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentBinary(), "/CMakeFiles");
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart);

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnBeginFileParse(
      this, currentStart);
  }
#endif

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
#ifdef CMake_ENABLE_DEBUGGER
    if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
      this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    }
#endif

    return;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      currentStart, listFile.Functions);
  }
#endif

  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "cmake_minimum_required"_s) {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (!cm::contains(allowedCommands, func.LowerCaseName())) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        cmPolicies::ApplyPolicyVersion(this, 2, 4, 0,
                                       cmPolicies::WarnCompat::Off);
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "project"_s) {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project{ "project",
                                  0,
                                  0,
                                  { { "Project", cmListFileArgument::Unquoted,
                                      0 },
                                    { "__CMAKE_INJECTED_PROJECT_COMMAND__",
                                      cmListFileArgument::Unquoted, 0 } } };
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->Defer = cm::make_unique<DeferCommands>();
  this->RunListFile(listFile, currentStart, this->Defer.get());
  this->Defer.reset();
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  auto sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}